

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O3

void __thiscall QMenuBar::setNativeMenuBar(QMenuBar *this,bool nativeMenuBar)

{
  long lVar1;
  long *plVar2;
  undefined8 uVar3;
  
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  plVar2 = *(long **)(lVar1 + 0x348);
  if ((plVar2 != (long *)0x0) != nativeMenuBar) {
    if (nativeMenuBar) {
      if (plVar2 == (long *)0x0) {
        uVar3 = (**(code **)(*QGuiApplicationPrivate::platform_theme + 0x20))();
        *(undefined8 *)(lVar1 + 0x348) = uVar3;
      }
      QWidget::updateGeometry(&this->super_QWidget);
      return;
    }
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 0x20))();
    }
    *(undefined8 *)(lVar1 + 0x348) = 0;
    *(byte *)(lVar1 + 0x254) = *(byte *)(lVar1 + 0x254) | 1;
    QWidget::updateGeometry(&this->super_QWidget);
    if (*(long *)(*(long *)&(this->super_QWidget).field_0x8 + 0x10) != 0) {
      (**(code **)(*(long *)&this->super_QWidget + 0x68))(this,1);
      return;
    }
  }
  return;
}

Assistant:

void QMenuBar::setNativeMenuBar(bool nativeMenuBar)
{
    Q_D(QMenuBar);
    if (nativeMenuBar != bool(d->platformMenuBar)) {
        if (!nativeMenuBar) {
            delete d->platformMenuBar;
            d->platformMenuBar = nullptr;
            d->itemsDirty = true;
        } else {
            if (!d->platformMenuBar)
                d->platformMenuBar = QGuiApplicationPrivate::platformTheme()->createPlatformMenuBar();
        }

        updateGeometry();
        if (!nativeMenuBar && parentWidget())
            setVisible(true);
    }
}